

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

int pybind11::detail::
    process_attributes<pybind11::name,_pybind11::is_method,_pybind11::sibling,_pybind11::detail::is_new_style_constructor,_char[1],_pybind11::arg,_pybind11::arg_v,_pybind11::return_value_policy>
    ::init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  process_attribute<pybind11::detail::is_new_style_constructor,_void> *in_RCX;
  process_attribute<pybind11::sibling,_void> *in_RDX;
  process_attribute<pybind11::is_method,_void> *in_RSI;
  process_attribute<const_char_*,_void> *in_R8;
  process_attribute<pybind11::arg,_void> *in_R9;
  int unused [9];
  int local_58 [10];
  process_attribute<pybind11::arg,_void> *local_30;
  process_attribute<const_char_*,_void> *local_28;
  process_attribute<pybind11::detail::is_new_style_constructor,_void> *local_20;
  process_attribute<pybind11::sibling,_void> *local_18;
  process_attribute<pybind11::is_method,_void> *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_58[0] = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = ctx;
  process_attribute<pybind11::name,_void>::init
            ((process_attribute<pybind11::name,_void> *)ctx,(EVP_PKEY_CTX *)unused._24_8_);
  local_58[1] = 0;
  process_attribute<pybind11::is_method,_void>::init(local_10,(EVP_PKEY_CTX *)unused._24_8_);
  local_58[2] = 0;
  process_attribute<pybind11::sibling,_void>::init(local_18,(EVP_PKEY_CTX *)unused._24_8_);
  local_58[3] = 0;
  process_attribute<pybind11::detail::is_new_style_constructor,_void>::init
            (local_20,(EVP_PKEY_CTX *)unused._24_8_);
  local_58[4] = 0;
  process_attribute<const_char_*,_void>::init(local_28,(EVP_PKEY_CTX *)unused._24_8_);
  local_58[5] = 0;
  process_attribute<pybind11::arg,_void>::init(local_30,(EVP_PKEY_CTX *)unused._24_8_);
  local_58[6] = 0;
  process_attribute<pybind11::arg_v,_void>::init
            ((process_attribute<pybind11::arg_v,_void> *)unused._8_8_,(EVP_PKEY_CTX *)unused._24_8_)
  ;
  local_58[7] = 0;
  process_attribute<pybind11::return_value_policy,_void>::init
            ((process_attribute<pybind11::return_value_policy,_void> *)unused._16_8_,
             (EVP_PKEY_CTX *)unused._24_8_);
  local_58[8] = 0;
  ignore_unused(local_58);
  return extraout_EAX;
}

Assistant:

static void init(const Args&... args, function_record *r) {
        int unused[] = { 0, (process_attribute<typename std::decay<Args>::type>::init(args, r), 0) ... };
        ignore_unused(unused);
    }